

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_GT_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_GT_Test *this)

{
  Fixed *pFVar1;
  int *in_R9;
  int x;
  AssertionResult iutest_ar;
  int local_1ec;
  AssertionResult local_1e8;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  local_1ec = 1;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
  iutest::internal::CmpHelperGT<int,int>
            (&local_1e8,(internal *)0x316376,"x",(char *)&local_190,&local_1ec,in_R9);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1ec);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xa2,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1e8);
    local_1ec = 1;
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperGT<int,int>
              (&local_1e8,(internal *)0x316376,"x",(char *)&local_190,&local_1ec,in_R9);
    if (local_1e8.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1ec);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xa4,local_1e8.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_1e8);
    local_1ec = 1;
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperGT<int,int>
              (&local_1e8,(internal *)0x316376,"x",(char *)&local_190,&local_1ec,in_R9);
    if (local_1e8.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1ec);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xa6,local_1e8.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_1e8);
    local_1ec = 1;
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperGT<int,int>
              (&local_1e8,(internal *)0x316376,"x",(char *)&local_190,&local_1ec,in_R9);
    if (local_1e8.m_result != false) goto LAB_002fef11;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1ec);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xa8,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002fef11:
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

TEST(GTestSyntaxTest, GT)
{
    if( int x = 1 )
        ASSERT_GT(2, x) << x;
    if( int x = 1 )
        EXPECT_GT(2, x) << x;
    if( int x = 1 )
        INFORM_GT(2, x) << x;
    if( int x = 1 )
        ASSUME_GT(2, x) << x;
}